

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Platform.cpp
# Opt level: O3

void __thiscall tcu::x11::X11Platform::X11Platform(X11Platform *this)

{
  EventState *this_00;
  X11GLPlatform *this_01;
  ContextFactory *pCVar1;
  MovePtr<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_> local_48;
  MovePtr<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_> local_38;
  
  Platform::Platform(&this->super_Platform);
  (this->super_Platform)._vptr_Platform = (_func_int **)&PTR__X11Platform_00b23920;
  this_00 = &this->m_eventState;
  EventState::EventState(this_00);
  VulkanPlatform::VulkanPlatform(&this->m_vkPlatform,this_00);
  x11::egl::Platform::Platform(&this->m_eglPlatform,this_00);
  this_01 = &this->m_glPlatform;
  glu::Platform::Platform(&this_01->super_Platform);
  glx::createContextFactory(&local_48,this_00);
  pCVar1 = local_48.super_UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>.
           m_data.ptr;
  local_48.super_UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>.m_data.
  ptr = (ContextFactory *)0x0;
  GenericFactoryRegistry::registerFactory
            ((GenericFactoryRegistry *)this_01,(AbstractFactory *)pCVar1);
  if (local_48.super_UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>.
      m_data.ptr != (ContextFactory *)0x0) {
    (*((local_48.super_UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>.
        m_data.ptr)->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[1])();
    local_48.super_UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>.m_data.
    ptr = (ContextFactory *)0x0;
  }
  x11::egl::Platform::createContextFactory(&local_38,&this->m_eglPlatform);
  pCVar1 = local_38.super_UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>.
           m_data.ptr;
  local_38.super_UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>.m_data.
  ptr = (ContextFactory *)0x0;
  GenericFactoryRegistry::registerFactory
            ((GenericFactoryRegistry *)this_01,(AbstractFactory *)pCVar1);
  if (local_38.super_UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>.
      m_data.ptr != (ContextFactory *)0x0) {
    (*((local_38.super_UniqueBase<glu::ContextFactory,_de::DefaultDeleter<glu::ContextFactory>_>.
        m_data.ptr)->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[1])();
  }
  return;
}

Assistant:

X11Platform::X11Platform (void)
	: m_vkPlatform	(m_eventState)
	, m_eglPlatform	(m_eventState)
{
#if defined (DEQP_SUPPORT_GLX)
	m_glPlatform.registerFactory(glx::createContextFactory(m_eventState));
#endif // DEQP_SUPPORT_GLX

	m_glPlatform.registerFactory(m_eglPlatform.createContextFactory());
}